

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O2

void __thiscall duckdb::UnzipCommand::ExecuteInternal(UnzipCommand *this,ExecuteContext *context)

{
  type pFVar1;
  long lVar2;
  CatalogException *pCVar3;
  allocator local_131;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_130;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_128;
  unique_ptr<char[],_std::default_delete<char[]>_> compressed_buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  VirtualFileSystem vfs;
  
  duckdb::VirtualFileSystem::VirtualFileSystem(&vfs);
  duckdb::FileSystem::OpenFile(&local_128,&vfs,&this->input_path,1,0x200,0);
  if (local_128._M_head_impl == (FileHandle *)0x0) {
    pCVar3 = (CatalogException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&compressed_buffer,"Cannot open the file \"%s\"",(allocator *)&local_130);
    std::__cxx11::string::string((string *)&local_e0,(string *)&this->input_path);
    CatalogException::CatalogException<std::__cxx11::string>
              (pCVar3,(string *)&compressed_buffer,&local_e0);
    __cxa_throw(pCVar3,&CatalogException::typeinfo,std::runtime_error::~runtime_error);
  }
  duckdb::FileSystem::OpenFile(&local_130,&vfs,&this->extraction_path,10,0x100,0);
  if (local_130._M_head_impl != (FileHandle *)0x0) {
    while( true ) {
      compressed_buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)operator_new__(0x100000);
      pFVar1 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)&local_128);
      lVar2 = duckdb::VirtualFileSystem::Read
                        ((FileHandle *)&vfs,pFVar1,
                         (long)compressed_buffer._M_t.
                               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl);
      if (lVar2 == 0) break;
      pFVar1 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)&local_130);
      duckdb::VirtualFileSystem::Write
                ((FileHandle *)&vfs,pFVar1,
                 (long)compressed_buffer._M_t.
                       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&compressed_buffer);
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&compressed_buffer);
    if (local_130._M_head_impl != (FileHandle *)0x0) {
      (**(code **)(*(long *)local_130._M_head_impl + 8))();
    }
    if (local_128._M_head_impl != (FileHandle *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
    }
    VirtualFileSystem::~VirtualFileSystem(&vfs);
    return;
  }
  pCVar3 = (CatalogException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&compressed_buffer,"Cannot open the file \"%s\"",&local_131);
  std::__cxx11::string::string((string *)&local_100,(string *)&this->extraction_path);
  CatalogException::CatalogException<std::__cxx11::string>
            (pCVar3,(string *)&compressed_buffer,&local_100);
  __cxa_throw(pCVar3,&CatalogException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void UnzipCommand::ExecuteInternal(ExecuteContext &context) const {
	VirtualFileSystem vfs;

	// input
	FileOpenFlags in_flags(FileFlags::FILE_FLAGS_READ);
	in_flags.SetCompression(FileCompressionType::GZIP);
	auto compressed_file_handle = vfs.OpenFile(input_path, in_flags);
	if (compressed_file_handle == nullptr) {
		throw CatalogException("Cannot open the file \"%s\"", input_path);
	}

	// output
	FileOpenFlags out_flags(FileOpenFlags::FILE_FLAGS_FILE_CREATE | FileOpenFlags::FILE_FLAGS_WRITE);
	auto output_file = vfs.OpenFile(extraction_path, out_flags);
	if (!output_file) {
		throw CatalogException("Cannot open the file \"%s\"", extraction_path);
	}

	// read the compressed data from the file
	while (true) {
		std::unique_ptr<char[]> compressed_buffer(new char[BUFFER_SIZE]);
		int64_t bytes_read = vfs.Read(*compressed_file_handle, compressed_buffer.get(), BUFFER_SIZE);
		if (bytes_read == 0) {
			break;
		}

		vfs.Write(*output_file, compressed_buffer.get(), bytes_read);
	}
}